

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void av1_get_second_pass_params(AV1_COMP *cpi,EncodeFrameParams *frame_params,uint frame_flags)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint in_EDX;
  long in_RSI;
  long *in_RDI;
  FIRSTPASS_STATS *this_frame_ptr_1;
  int ori_gf_int;
  int is_last_scenecut;
  int next_region;
  int this_region;
  int this_idx;
  int need_gf_len;
  int cur_region_idx;
  int ret;
  int rest_frames;
  int max_gop_length;
  FIRSTPASS_STATS this_frame_copy;
  FIRSTPASS_STATS this_frame;
  int frames_to_key;
  int num_frames_to_detect_scenecut;
  FIRSTPASS_STATS *this_frame_ptr;
  int update_type;
  int frames_to_next_forced_key;
  int update_total_stats;
  FIRSTPASS_STATS *start_pos;
  AV1EncoderConfig *oxcf;
  GF_GROUP *gf_group;
  TWO_PASS *twopass;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMP *in_stack_fffffffffffffd60;
  FIRSTPASS_STATS *position;
  undefined6 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6e;
  undefined1 in_stack_fffffffffffffd6f;
  int in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  int local_288;
  int local_284;
  int in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined1 local_238 [64];
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  FIRSTPASS_INFO *in_stack_fffffffffffffe10;
  AV1_COMP *in_stack_fffffffffffffe18;
  undefined1 local_150 [180];
  int in_stack_ffffffffffffff64;
  EncodeFrameParams *in_stack_ffffffffffffff68;
  AV1_COMP *in_stack_ffffffffffffff70;
  uint local_14;
  
  lVar2 = *in_RDI;
  lVar11 = lVar2 + 0x8b30;
  lVar3 = *in_RDI;
  lVar4 = *in_RDI;
  lVar12 = lVar4 + 400;
  if (((int)in_RDI[0x13acb] == 0) || (*(char *)((long)in_RDI + 0x9d661) != '\x01')) {
    position = (FIRSTPASS_STATS *)in_RDI[0x13ac3];
    bVar5 = false;
    iVar6 = is_stat_consumption_stage(in_stack_fffffffffffffd60);
    if ((iVar6 == 0) || (in_RDI[0x13ac3] != 0)) {
      iVar6 = detect_app_forced_key(in_stack_fffffffffffffd60);
      if (iVar6 == 0) {
        *(undefined4 *)((long)in_RDI + 0x6079c) = 0;
        local_14 = in_EDX & 1;
      }
      else {
        local_14 = in_EDX;
        if ((0 < iVar6) && (iVar6 < *(int *)((long)in_RDI + 0x6079c))) {
          *(int *)((long)in_RDI + 0x6079c) = iVar6;
        }
      }
      cVar1 = *(char *)(lVar12 + (ulong)*(byte *)(in_RDI + 0xe258));
      *(undefined1 *)(in_RSI + 4) =
           *(undefined1 *)(lVar4 + 0x1810 + (ulong)*(byte *)(in_RDI + 0xe258));
      local_288 = in_stack_fffffffffffffd74;
      if ((((int)(uint)*(byte *)(in_RDI + 0xe258) < *(int *)(lVar4 + 0x1a08)) &&
          ((local_14 & 1) == 0)) &&
         ((setup_target_rate((AV1_COMP *)
                             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)),
          cVar1 == '\x03' || (local_288 = in_stack_fffffffffffffd74, cVar1 == '\x06')))) {
        read_frame_stats((TWO_PASS *)(lVar3 + 0x5bc0),(TWO_PASS_FRAME *)(in_RDI + 0x13ac3),
                         (uint)*(byte *)(lVar4 + 0x28a + (ulong)*(byte *)(in_RDI + 0xe258)));
        set_twopass_params_based_on_fp_stats
                  ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (FIRSTPASS_STATS *)
                   CONCAT17(in_stack_fffffffffffffd6f,
                            CONCAT16(in_stack_fffffffffffffd6e,in_stack_fffffffffffffd68)));
      }
      else {
        if (*(int *)((long)in_RDI + 0x423dc) == 3) {
          *(int *)((long)in_RDI + 0x60844) = (int)in_RDI[0x847b];
        }
        if (((((uint)*(byte *)(in_RDI + 0xe258) == *(uint *)(lVar4 + 0x1a08)) &&
             (*(int *)(*in_RDI + 0x5a88) != 0)) && (*(int *)(*in_RDI + 0xaca0) != 0)) &&
           (iVar6 = define_kf_interval(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                                       in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
           iVar6 != -1)) {
          if (*(int *)((long)in_RDI + 0x6079c) < iVar6) {
            iVar6 = *(int *)((long)in_RDI + 0x6079c);
          }
          *(int *)((long)in_RDI + 0x6079c) = iVar6;
          in_stack_fffffffffffffd90 = iVar6;
        }
        memset(local_150,0,0xe8);
        iVar6 = is_stat_consumption_stage(in_stack_fffffffffffffd60);
        if (iVar6 == 0) {
          *(int *)((long)in_RDI + 0x60844) = (int)in_RDI[0x847b];
        }
        else if (((int)(uint)*(byte *)(in_RDI + 0xe258) < *(int *)(lVar4 + 0x1a08)) ||
                (*(int *)((long)in_RDI + 0x6079c) == 0)) {
          process_first_pass_stats
                    ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (FIRSTPASS_STATS *)
                     CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          bVar5 = true;
        }
        memcpy(local_238,local_150,0xe8);
        if (*(int *)((long)in_RDI + 0x6079c) < 1) {
          *(undefined1 *)(in_RSI + 4) = 0;
          find_next_key_frame((AV1_COMP *)this_frame_copy.count,
                              (FIRSTPASS_STATS *)this_frame_copy.duration);
          memcpy(local_150,local_238,0xe8);
        }
        if (*(int *)((long)in_RDI + 0x607a4) < 1) {
          *(undefined4 *)((long)in_RDI + 0x607a4) = *(undefined4 *)((long)in_RDI + 0x42384);
        }
        if ((uint)*(byte *)(in_RDI + 0xe258) == *(uint *)(lVar4 + 0x1a08)) {
          av1_tf_info_reset((TEMPORAL_FILTER_INFO *)0x29867f);
          if ((int)in_RDI[0x848a] < 0x20) {
            iVar6 = 0x10;
          }
          else if ((int)in_RDI[0x848a] - (int)in_RDI[0x846b] / 2 < 0x21) {
            in_stack_fffffffffffffd88 = (int)in_RDI[0x848a];
            iVar6 = in_stack_fffffffffffffd88 - (int)in_RDI[0x846b] / 2;
            in_stack_fffffffffffffd8c = iVar6;
          }
          else {
            iVar6 = 0x20;
            in_stack_fffffffffffffd8c = iVar6;
          }
          local_284 = iVar6;
          if ((0 < *(int *)((long)in_RDI + 0x42384)) &&
             (in_stack_fffffffffffffd80 = iVar6, *(int *)((long)in_RDI + 0x607a4) + 1 < iVar6)) {
            in_stack_fffffffffffffd80 = *(int *)((long)in_RDI + 0x607a4) + 1;
            local_284 = in_stack_fffffffffffffd80;
          }
          if ((int)in_RDI[0x848a] == 0) {
            local_284 = *(int *)((long)in_RDI + 0x60794);
          }
          if (*(int *)((long)in_RDI + 0x6079c) <= local_284) {
            local_284 = *(int *)((long)in_RDI + 0x6079c);
          }
          if ((((int)in_RDI[0xc0f4] == 0) || ((int)in_RDI[0xc0f4] == 1)) ||
             ((*(int *)(lVar2 + 0xac5c) - (int)in_RDI[0xc0f4] < *(int *)((long)in_RDI + 0x6079c) &&
              (*(int *)(lVar2 + 0xac5c) - (int)in_RDI[0xc0f4] < local_284 + 1)))) {
            if (*(int *)((long)in_RDI + 0x6079c) < 0x96) {
              local_288 = *(int *)((long)in_RDI + 0x6079c);
            }
            else {
              local_288 = 0x96;
            }
            in_stack_fffffffffffffd70 = local_288;
            if ((int)((int)((*(long *)(*(long *)(lVar3 + 0x5d58) + 8) - in_RDI[0x13ac3]) / 0xe8) +
                     (uint)((int)in_RDI[0xc0f4] == 0)) <= local_288) {
              in_stack_fffffffffffffd70 =
                   (int)((*(long *)(*(long *)(lVar3 + 0x5d58) + 8) - in_RDI[0x13ac3]) / 0xe8) +
                   (uint)((int)in_RDI[0xc0f4] == 0);
            }
            *(int *)(lVar2 + 0xac5c) = in_stack_fffffffffffffd70;
            in_stack_fffffffffffffdc0 = in_stack_fffffffffffffd70;
            if (*(int *)(*in_RDI + 0x5a88) == 0) {
              in_stack_fffffffffffffdbc =
                   identify_regions((FIRSTPASS_STATS *)
                                    CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                                    in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0,
                                    (REGIONS *)
                                    CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                                    (int *)CONCAT44(in_stack_fffffffffffffda4,
                                                    in_stack_fffffffffffffda0));
            }
            else {
              mark_flashes((FIRSTPASS_STATS *)**(undefined8 **)(lVar3 + 0x5d58),
                           *(FIRSTPASS_STATS **)(*(long *)(lVar3 + 0x5d58) + 8));
              estimate_noise((FIRSTPASS_STATS *)
                             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                             (FIRSTPASS_STATS *)
                             CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                             (aom_internal_error_info *)
                             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
              estimate_coeff((FIRSTPASS_STATS *)CONCAT44(local_284,in_stack_fffffffffffffdc0),
                             (FIRSTPASS_STATS *)
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
              in_stack_fffffffffffffdbc =
                   identify_regions((FIRSTPASS_STATS *)
                                    CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                                    in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0,
                                    (REGIONS *)
                                    CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                                    (int *)CONCAT44(in_stack_fffffffffffffda4,
                                                    in_stack_fffffffffffffda0));
            }
            if (in_stack_fffffffffffffdbc == -1) {
              aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                                 "Error allocating buffers in identify_regions");
            }
          }
          iVar7 = find_regions_index((REGIONS *)(lVar2 + 0x8b88),*(int *)(lVar2 + 0x8b80),
                                     (int)in_RDI[0xc0f4] - *(int *)(lVar2 + 0xac58));
          if (((-1 < iVar7) && (*(int *)(lVar11 + (long)iVar7 * 0x38 + 0x88) == 2)) ||
             ((int)in_RDI[0xc0f4] == 0)) {
            *(undefined4 *)(*in_RDI + 0x5a84) = 0;
          }
          calculate_gf_length((AV1_COMP *)this_frame_copy.coded_error,
                              this_frame_copy.frame_avg_wavelet_energy._4_4_,
                              this_frame_copy.frame_avg_wavelet_energy._0_4_);
          if (((0x10 < local_284) && ((*(byte *)((long)in_RDI + 0x42361) & 1) != 0)) &&
             ((0x1f < (int)in_RDI[0x848a] && (*(int *)((long)in_RDI + 0x60904) != 3)))) {
            iVar8 = (((int)in_RDI[0xc0f4] +
                     *(int *)(lVar2 + 0x8b40 + (long)*(int *)(lVar2 + 0x8b7c) * 4)) -
                    *(int *)(lVar2 + 0xac58)) + -1;
            iVar9 = find_regions_index((REGIONS *)(lVar2 + 0x8b88),*(int *)(lVar2 + 0x8b80),iVar8);
            iVar8 = find_regions_index((REGIONS *)(lVar2 + 0x8b88),*(int *)(lVar2 + 0x8b80),
                                       iVar8 + 1);
            in_stack_fffffffffffffd6f = true;
            if ((*(int *)(lVar2 + 0x8b40 + (long)*(int *)(lVar2 + 0x8b7c) * 4) <
                 *(int *)((long)in_RDI + 0x6079c)) &&
               (((iVar9 == -1 ||
                 (in_stack_fffffffffffffd6f = true,
                 *(int *)(lVar11 + (long)iVar9 * 0x38 + 0x88) != 2)) &&
                (in_stack_fffffffffffffd6e = false,
                in_stack_fffffffffffffd6f = in_stack_fffffffffffffd6e, iVar8 != -1)))) {
              in_stack_fffffffffffffd6e = *(int *)(lVar11 + (long)iVar8 * 0x38 + 0x88) == 2;
              in_stack_fffffffffffffd6f = in_stack_fffffffffffffd6e;
            }
            uVar10 = (uint)(byte)in_stack_fffffffffffffd6f;
            iVar8 = *(int *)(lVar2 + 0x8b40 + (long)*(int *)(lVar2 + 0x8b7c) * 4);
            if ((0x10 < *(int *)(lVar2 + 0x8b40 + (long)*(int *)(lVar2 + 0x8b7c) * 4)) &&
               ((int)in_RDI[0xc0f2] < 0x11)) {
              define_gf_group(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                              in_stack_ffffffffffffff64);
              av1_tf_info_filtering
                        ((TEMPORAL_FILTER_INFO *)
                         CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                         (AV1_COMP *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                         (GF_GROUP *)CONCAT44(iVar6,in_stack_fffffffffffffd80));
              memcpy(local_150,local_238,0xe8);
              iVar9 = is_shorter_gf_interval_better
                                ((AV1_COMP *)
                                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                                 (EncodeFrameParams *)
                                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
              if (iVar9 != 0) {
                local_284 = 0x10;
                calculate_gf_length((AV1_COMP *)this_frame_copy.coded_error,
                                    this_frame_copy.frame_avg_wavelet_energy._4_4_,
                                    this_frame_copy.frame_avg_wavelet_energy._0_4_);
                if ((uVar10 != 0) &&
                   (iVar8 - *(int *)(lVar2 + 0x8b40 + (long)*(int *)(lVar2 + 0x8b7c) * 4) < 4)) {
                  *(int *)(lVar2 + 0x8b40 + (long)*(int *)(lVar2 + 0x8b7c) * 4) = iVar8;
                }
              }
            }
          }
          define_gf_group(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff64);
          if ((*(char *)(lVar12 + (ulong)*(byte *)(in_RDI + 0xe258)) != '\x03') &&
             (0 < (int)in_RDI[0xc0f4])) {
            process_first_pass_stats
                      ((AV1_COMP *)CONCAT44(local_284,in_stack_fffffffffffffdc0),
                       (FIRSTPASS_STATS *)CONCAT44(in_stack_fffffffffffffdbc,iVar7));
          }
          define_gf_group(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff64);
          av1_tf_info_filtering
                    ((TEMPORAL_FILTER_INFO *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     (AV1_COMP *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     (GF_GROUP *)CONCAT44(iVar6,in_stack_fffffffffffffd80));
          *(undefined4 *)(in_RDI + 0xc0f1) = *(undefined4 *)(lVar2 + 0xac60);
        }
        if ((*(char *)(lVar12 + (ulong)*(byte *)(in_RDI + 0xe258)) == '\x03') ||
           (*(char *)(lVar12 + (ulong)*(byte *)(in_RDI + 0xe258)) == '\x06')) {
          reset_fpf_position((TWO_PASS_FRAME *)(in_RDI + 0x13ac3),position);
          read_frame_stats((TWO_PASS *)(lVar3 + 0x5bc0),(TWO_PASS_FRAME *)(in_RDI + 0x13ac3),
                           (uint)*(byte *)(lVar4 + 0x28a + (ulong)*(byte *)(in_RDI + 0xe258)));
          set_twopass_params_based_on_fp_stats
                    ((AV1_COMP *)CONCAT44(local_288,in_stack_fffffffffffffd70),
                     (FIRSTPASS_STATS *)
                     CONCAT17(in_stack_fffffffffffffd6f,
                              CONCAT16(in_stack_fffffffffffffd6e,in_stack_fffffffffffffd68)));
        }
        else {
          if (!bVar5) {
            position = (FIRSTPASS_STATS *)0x0;
          }
          in_RDI[0x13ac4] = (long)position;
        }
        *(undefined1 *)(in_RSI + 4) =
             *(undefined1 *)(lVar4 + 0x1810 + (ulong)*(byte *)(in_RDI + 0xe258));
        setup_target_rate((AV1_COMP *)CONCAT44(local_288,in_stack_fffffffffffffd70));
      }
    }
  }
  else {
    *(undefined1 *)(in_RSI + 4) =
         *(undefined1 *)(lVar4 + 0x1810 + (ulong)*(byte *)(in_RDI + 0xe258));
    uVar13 = CONCAT13(1,(int3)in_stack_fffffffffffffd94);
    if (*(char *)(lVar12 + (ulong)*(byte *)(in_RDI + 0xe258)) != '\x03') {
      uVar13 = CONCAT13(*(char *)(lVar12 + (ulong)*(byte *)(in_RDI + 0xe258)) == '\x06',
                        (int3)in_stack_fffffffffffffd94);
    }
    *(uint *)(in_RSI + 0x10) = (uint)(((byte)((uint)uVar13 >> 0x18) ^ 0xff) & 1);
    if ((char)in_RDI[0xe258] == '\0') {
      av1_tf_info_reset((TEMPORAL_FILTER_INFO *)0x298247);
      av1_tf_info_filtering
                ((TEMPORAL_FILTER_INFO *)CONCAT44(uVar13,in_stack_fffffffffffffd90),
                 (AV1_COMP *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 (GF_GROUP *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    }
  }
  return;
}

Assistant:

void av1_get_second_pass_params(AV1_COMP *cpi,
                                EncodeFrameParams *const frame_params,
                                unsigned int frame_flags) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  if (cpi->use_ducky_encode &&
      cpi->ducky_encode_info.frame_info.gop_mode == DUCKY_ENCODE_GOP_MODE_RCL) {
    frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];
    frame_params->show_frame =
        !(gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
          gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE);
    if (cpi->gf_frame_index == 0) {
      av1_tf_info_reset(&cpi->ppi->tf_info);
      av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);
    }
    return;
  }

  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  int update_total_stats = 0;

  if (is_stat_consumption_stage(cpi) && !cpi->twopass_frame.stats_in) return;

  // Check forced key frames.
  const int frames_to_next_forced_key = detect_app_forced_key(cpi);
  if (frames_to_next_forced_key == 0) {
    rc->frames_to_key = 0;
    frame_flags &= FRAMEFLAGS_KEY;
  } else if (frames_to_next_forced_key > 0 &&
             frames_to_next_forced_key < rc->frames_to_key) {
    rc->frames_to_key = frames_to_next_forced_key;
  }

  assert(cpi->twopass_frame.stats_in != NULL);
  const int update_type = gf_group->update_type[cpi->gf_frame_index];
  frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];

  if (cpi->gf_frame_index < gf_group->size && !(frame_flags & FRAMEFLAGS_KEY)) {
    assert(cpi->gf_frame_index < gf_group->size);

    setup_target_rate(cpi);

    // If this is an arf frame then we dont want to read the stats file or
    // advance the input pointer as we already have what we need.
    if (update_type == ARF_UPDATE || update_type == INTNL_ARF_UPDATE) {
      const FIRSTPASS_STATS *const this_frame_ptr =
          read_frame_stats(twopass, &cpi->twopass_frame,
                           gf_group->arf_src_offset[cpi->gf_frame_index]);
      set_twopass_params_based_on_fp_stats(cpi, this_frame_ptr);
      return;
    }
  }

  if (oxcf->rc_cfg.mode == AOM_Q)
    rc->active_worst_quality = oxcf->rc_cfg.cq_level;

  if (cpi->gf_frame_index == gf_group->size) {
    if (cpi->ppi->lap_enabled && cpi->ppi->p_rc.enable_scenecut_detection) {
      const int num_frames_to_detect_scenecut = MAX_GF_LENGTH_LAP + 1;
      const int frames_to_key = define_kf_interval(
          cpi, &twopass->firstpass_info, num_frames_to_detect_scenecut,
          /*search_start_idx=*/0);
      if (frames_to_key != -1)
        rc->frames_to_key = AOMMIN(rc->frames_to_key, frames_to_key);
    }
  }

  FIRSTPASS_STATS this_frame;
  av1_zero(this_frame);
  // call above fn
  if (is_stat_consumption_stage(cpi)) {
    if (cpi->gf_frame_index < gf_group->size || rc->frames_to_key == 0) {
      process_first_pass_stats(cpi, &this_frame);
      update_total_stats = 1;
    }
  } else {
    rc->active_worst_quality = oxcf->rc_cfg.cq_level;
  }

  // Keyframe and section processing.
  FIRSTPASS_STATS this_frame_copy;
  this_frame_copy = this_frame;
  if (rc->frames_to_key <= 0) {
    assert(rc->frames_to_key == 0);
    // Define next KF group and assign bits to it.
    frame_params->frame_type = KEY_FRAME;
    find_next_key_frame(cpi, &this_frame);
    this_frame = this_frame_copy;
  }

  if (rc->frames_to_fwd_kf <= 0)
    rc->frames_to_fwd_kf = oxcf->kf_cfg.fwd_kf_dist;

  // Define a new GF/ARF group. (Should always enter here for key frames).
  if (cpi->gf_frame_index == gf_group->size) {
    av1_tf_info_reset(&cpi->ppi->tf_info);
#if CONFIG_BITRATE_ACCURACY && !CONFIG_THREE_PASS
    vbr_rc_reset_gop_data(&cpi->vbr_rc_info);
#endif  // CONFIG_BITRATE_ACCURACY
    int max_gop_length =
        (oxcf->gf_cfg.lag_in_frames >= 32)
            ? AOMMIN(MAX_GF_INTERVAL, oxcf->gf_cfg.lag_in_frames -
                                          oxcf->algo_cfg.arnr_max_frames / 2)
            : MAX_GF_LENGTH_LAP;

    // Handle forward key frame when enabled.
    if (oxcf->kf_cfg.fwd_kf_dist > 0)
      max_gop_length = AOMMIN(rc->frames_to_fwd_kf + 1, max_gop_length);

    // Use the provided gop size in low delay setting
    if (oxcf->gf_cfg.lag_in_frames == 0) max_gop_length = rc->max_gf_interval;

    // Limit the max gop length for the last gop in 1 pass setting.
    max_gop_length = AOMMIN(max_gop_length, rc->frames_to_key);

    // Identify regions if needed.
    // TODO(bohanli): identify regions for all stats available.
    if (rc->frames_since_key == 0 || rc->frames_since_key == 1 ||
        (p_rc->frames_till_regions_update - rc->frames_since_key <
             rc->frames_to_key &&
         p_rc->frames_till_regions_update - rc->frames_since_key <
             max_gop_length + 1)) {
      // how many frames we can analyze from this frame
      int rest_frames =
          AOMMIN(rc->frames_to_key, MAX_FIRSTPASS_ANALYSIS_FRAMES);
      rest_frames =
          AOMMIN(rest_frames, (int)(twopass->stats_buf_ctx->stats_in_end -
                                    cpi->twopass_frame.stats_in +
                                    (rc->frames_since_key == 0)));
      p_rc->frames_till_regions_update = rest_frames;

      int ret;
      if (cpi->ppi->lap_enabled) {
        mark_flashes(twopass->stats_buf_ctx->stats_in_start,
                     twopass->stats_buf_ctx->stats_in_end);
        estimate_noise(twopass->stats_buf_ctx->stats_in_start,
                       twopass->stats_buf_ctx->stats_in_end, cpi->common.error);
        estimate_coeff(twopass->stats_buf_ctx->stats_in_start,
                       twopass->stats_buf_ctx->stats_in_end);
        ret = identify_regions(cpi->twopass_frame.stats_in, rest_frames,
                               (rc->frames_since_key == 0), p_rc->regions,
                               &p_rc->num_regions);
      } else {
        ret = identify_regions(
            cpi->twopass_frame.stats_in - (rc->frames_since_key == 0),
            rest_frames, 0, p_rc->regions, &p_rc->num_regions);
      }
      if (ret == -1) {
        aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                           "Error allocating buffers in identify_regions");
      }
    }

    int cur_region_idx =
        find_regions_index(p_rc->regions, p_rc->num_regions,
                           rc->frames_since_key - p_rc->regions_offset);
    if ((cur_region_idx >= 0 &&
         p_rc->regions[cur_region_idx].type == SCENECUT_REGION) ||
        rc->frames_since_key == 0) {
      // If we start from a scenecut, then the last GOP's arf boost is not
      // needed for this GOP.
      cpi->ppi->gf_state.arf_gf_boost_lst = 0;
    }

    int need_gf_len = 1;
#if CONFIG_THREE_PASS
    if (cpi->third_pass_ctx && oxcf->pass == AOM_RC_THIRD_PASS) {
      // set up bitstream to read
      if (!cpi->third_pass_ctx->input_file_name && oxcf->two_pass_output) {
        cpi->third_pass_ctx->input_file_name = oxcf->two_pass_output;
      }
      av1_open_second_pass_log(cpi, 1);
      THIRD_PASS_GOP_INFO *gop_info = &cpi->third_pass_ctx->gop_info;
      // Read in GOP information from the second pass file.
      av1_read_second_pass_gop_info(cpi->second_pass_log_stream, gop_info,
                                    cpi->common.error);
#if CONFIG_BITRATE_ACCURACY
      TPL_INFO *tpl_info;
      AOM_CHECK_MEM_ERROR(cpi->common.error, tpl_info,
                          aom_malloc(sizeof(*tpl_info)));
      av1_read_tpl_info(tpl_info, cpi->second_pass_log_stream,
                        cpi->common.error);
      aom_free(tpl_info);
#if CONFIG_THREE_PASS
      // TODO(angiebird): Put this part into a func
      cpi->vbr_rc_info.cur_gop_idx++;
#endif  // CONFIG_THREE_PASS
#endif  // CONFIG_BITRATE_ACCURACY
      // Read in third_pass_info from the bitstream.
      av1_set_gop_third_pass(cpi->third_pass_ctx);
      // Read in per-frame info from second-pass encoding
      av1_read_second_pass_per_frame_info(
          cpi->second_pass_log_stream, cpi->third_pass_ctx->frame_info,
          gop_info->num_frames, cpi->common.error);

      p_rc->cur_gf_index = 0;
      p_rc->gf_intervals[0] = cpi->third_pass_ctx->gop_info.gf_length;
      need_gf_len = 0;
    }
#endif  // CONFIG_THREE_PASS

    if (need_gf_len) {
      // If we cannot obtain GF group length from second_pass_file
      // TODO(jingning): Resolve the redundant calls here.
      if (rc->intervals_till_gf_calculate_due == 0 || 1) {
        calculate_gf_length(cpi, max_gop_length, MAX_NUM_GF_INTERVALS);
      }

      if (max_gop_length > 16 && oxcf->algo_cfg.enable_tpl_model &&
          oxcf->gf_cfg.lag_in_frames >= 32 &&
          cpi->sf.tpl_sf.gop_length_decision_method != 3) {
        int this_idx = rc->frames_since_key +
                       p_rc->gf_intervals[p_rc->cur_gf_index] -
                       p_rc->regions_offset - 1;
        int this_region =
            find_regions_index(p_rc->regions, p_rc->num_regions, this_idx);
        int next_region =
            find_regions_index(p_rc->regions, p_rc->num_regions, this_idx + 1);
        // TODO(angiebird): Figure out why this_region and next_region are -1 in
        // unit test like AltRefFramePresenceTestLarge (aomedia:3134)
        int is_last_scenecut =
            p_rc->gf_intervals[p_rc->cur_gf_index] >= rc->frames_to_key ||
            (this_region != -1 &&
             p_rc->regions[this_region].type == SCENECUT_REGION) ||
            (next_region != -1 &&
             p_rc->regions[next_region].type == SCENECUT_REGION);

        int ori_gf_int = p_rc->gf_intervals[p_rc->cur_gf_index];

        if (p_rc->gf_intervals[p_rc->cur_gf_index] > 16 &&
            rc->min_gf_interval <= 16) {
          // The calculate_gf_length function is previously used with
          // max_gop_length = 32 with look-ahead gf intervals.
          define_gf_group(cpi, frame_params, 0);
          av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);
          this_frame = this_frame_copy;

          if (is_shorter_gf_interval_better(cpi, frame_params)) {
            // A shorter gf interval is better.
            // TODO(jingning): Remove redundant computations here.
            max_gop_length = 16;
            calculate_gf_length(cpi, max_gop_length, 1);
            if (is_last_scenecut &&
                (ori_gf_int - p_rc->gf_intervals[p_rc->cur_gf_index] < 4)) {
              p_rc->gf_intervals[p_rc->cur_gf_index] = ori_gf_int;
            }
          }
        }
      }
    }

    define_gf_group(cpi, frame_params, 0);

    if (gf_group->update_type[cpi->gf_frame_index] != ARF_UPDATE &&
        rc->frames_since_key > 0)
      process_first_pass_stats(cpi, &this_frame);

    define_gf_group(cpi, frame_params, 1);

#if CONFIG_THREE_PASS
    // write gop info if needed for third pass. Per-frame info is written after
    // each frame is encoded.
    av1_write_second_pass_gop_info(cpi);
#endif  // CONFIG_THREE_PASS

    av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);

    rc->frames_till_gf_update_due = p_rc->baseline_gf_interval;
    assert(cpi->gf_frame_index == 0);
#if ARF_STATS_OUTPUT
    {
      FILE *fpfile;
      fpfile = fopen("arf.stt", "a");
      ++arf_count;
      fprintf(fpfile, "%10d %10d %10d %10d %10d\n",
              cpi->common.current_frame.frame_number,
              rc->frames_till_gf_update_due, cpi->ppi->p_rc.kf_boost, arf_count,
              p_rc->gfu_boost);

      fclose(fpfile);
    }
#endif
  }
  assert(cpi->gf_frame_index < gf_group->size);

  if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
      gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
    reset_fpf_position(&cpi->twopass_frame, start_pos);

    const FIRSTPASS_STATS *const this_frame_ptr =
        read_frame_stats(twopass, &cpi->twopass_frame,
                         gf_group->arf_src_offset[cpi->gf_frame_index]);
    set_twopass_params_based_on_fp_stats(cpi, this_frame_ptr);
  } else {
    // Back up this frame's stats for updating total stats during post encode.
    cpi->twopass_frame.this_frame = update_total_stats ? start_pos : NULL;
  }

  frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];
  setup_target_rate(cpi);
}